

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ct_constant.hpp
# Opt level: O0

string * __thiscall
viennamath::ct_constant<0l>::str_abi_cxx11_(string *__return_storage_ptr__,ct_constant<0l> *this)

{
  ostream *poVar1;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  ct_constant<0l> *local_18;
  ct_constant<0L> *this_local;
  
  local_18 = this;
  this_local = (ct_constant<0L> *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"ct_constant<");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  std::operator<<(poVar1,">");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string str() const
      {
        std::stringstream ss;
        ss << "ct_constant<" << value_ << ">";
        return ss.str();
      }